

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QString * __thiscall
QTimeZone::displayName(QTimeZone *this,QDateTime *atDateTime,NameType nameType,QLocale *locale)

{
  long lVar1;
  bool bVar2;
  TimeSpec TVar3;
  QTimeZonePrivate *pQVar4;
  qint64 qVar5;
  uint in_ECX;
  QTimeZone *in_RDX;
  ShortData *in_RSI;
  QString *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  qint32 in_stack_000000dc;
  QUtcTimeZonePrivate *in_stack_ffffffffffffff00;
  QTimeZone *in_stack_ffffffffffffff08;
  NameType nameType_00;
  QUtcTimeZonePrivate *in_stack_ffffffffffffff18;
  QString *this_00;
  QLocale *in_stack_ffffffffffffff48;
  NameType nameType_01;
  undefined4 in_stack_ffffffffffffff58;
  QUtcTimeZonePrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = Data::isShort((Data *)in_RSI);
  if (bVar2) {
    TVar3 = ShortData::spec(in_RSI);
    nameType_00 = (NameType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    nameType_01 = (NameType)((ulong)in_R8 >> 0x20);
    if (TVar3 == LocalTime) {
      systemTimeZone();
      displayName(in_RDX,(QDateTime *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),nameType_01,
                  in_stack_ffffffffffffff48);
      ~QTimeZone((QTimeZone *)0x58038c);
      goto LAB_0058048a;
    }
    if (TVar3 - UTC < 2) {
      QUtcTimeZonePrivate::QUtcTimeZonePrivate(in_stack_ffffffffffffffc0,in_stack_000000dc);
      qVar5 = QDateTime::toMSecsSinceEpoch((QDateTime *)this_00);
      QUtcTimeZonePrivate::displayName
                (in_stack_ffffffffffffff18,qVar5,nameType_00,(QLocale *)in_stack_ffffffffffffff00);
      QUtcTimeZonePrivate::~QUtcTimeZonePrivate(in_stack_ffffffffffffff00);
      goto LAB_0058048a;
    }
  }
  else {
    bVar2 = isValid(in_stack_ffffffffffffff08);
    if (bVar2) {
      pQVar4 = Data::operator->((Data *)in_RSI);
      qVar5 = QDateTime::toMSecsSinceEpoch((QDateTime *)this_00);
      (*pQVar4->_vptr_QTimeZonePrivate[5])(this_00,pQVar4,qVar5,(ulong)in_ECX,in_R8);
      goto LAB_0058048a;
    }
  }
  QString::QString((QString *)0x58048a);
LAB_0058048a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTimeZone::displayName(const QDateTime &atDateTime, NameType nameType,
                               const QLocale &locale) const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().displayName(atDateTime, nameType, locale);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            return QUtcTimeZonePrivate(d.s.offset).displayName(
                atDateTime.toMSecsSinceEpoch(), nameType, locale);
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (isValid()) {
        return d->displayName(atDateTime.toMSecsSinceEpoch(), nameType, locale);
    }

    return QString();
}